

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O0

void ncnn::conv3x3s1_winograd23(Mat *bottom_blob,Mat *top_blob,Mat *AT,Mat *bias,int nT,Option *opt)

{
  int *piVar1;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  long in_R9;
  int in_stack_000001a4;
  int in_stack_000001a8;
  int in_stack_000001ac;
  Mat *in_stack_000001b0;
  Mat *in_stack_000001b8;
  Mat *in_stack_000001c0;
  Mat BT_tile_2;
  Mat AT_tile;
  int max_kk_2;
  int k_2;
  int max_jj_2;
  int j_2;
  int max_ii;
  Mat top_tile;
  int i;
  int ppj_2;
  Mat top_tileX;
  Mat BT_tile_1;
  Mat B_tile_1;
  int max_kk_1;
  int max_jj_1;
  int k_1;
  int j_1;
  int ppk_1;
  int ppj_1;
  int ppjk_1;
  Mat B_tileX;
  Mat BT_tile;
  int max_kk;
  int max_jj;
  int k;
  int j;
  int ppk;
  int ppj;
  int ppjk;
  Mat B_tile;
  int nn_NK;
  Mat BT;
  int nn_K;
  int nn_N;
  int nn_M;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  int B;
  int K;
  int N;
  int M;
  int tiles;
  int h_tiles;
  int w_tiles;
  int outh;
  int outw;
  Mat *m_5;
  int in_stack_00000978;
  int in_stack_0000097c;
  Mat *in_stack_00000980;
  Mat *in_stack_00000988;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Mat *m_4;
  int in_stack_00000fdc;
  int in_stack_00000fe0;
  int in_stack_00000fe4;
  Mat *in_stack_00000fe8;
  Mat *in_stack_00000ff0;
  Mat *in_stack_00000ff8;
  int in_stack_fffffffffffff110;
  int in_stack_fffffffffffff118;
  undefined4 in_stack_fffffffffffff11c;
  int in_stack_fffffffffffff120;
  int in_stack_fffffffffffff124;
  size_t in_stack_fffffffffffff128;
  void **ppvVar2;
  Mat *in_stack_fffffffffffff130;
  int _c;
  int in_stack_fffffffffffff138;
  int in_stack_fffffffffffff13c;
  Mat *in_stack_fffffffffffff140;
  int *in_stack_fffffffffffff160;
  int *in_stack_fffffffffffff168;
  int *in_stack_fffffffffffff170;
  undefined8 in_stack_fffffffffffff178;
  undefined8 in_stack_fffffffffffff180;
  Allocator *in_stack_fffffffffffff190;
  undefined8 local_d20;
  undefined8 local_d18;
  undefined8 local_d10;
  undefined4 local_d08;
  long *local_d00;
  undefined4 local_cf8;
  undefined4 local_cf4;
  undefined4 local_cf0;
  undefined4 local_cec;
  undefined4 local_ce8;
  undefined8 local_ce0;
  void *local_cd8;
  int *local_cd0;
  long local_cc8;
  undefined4 local_cc0;
  long *local_cb8;
  undefined4 local_cb0;
  int local_cac;
  int local_ca8;
  undefined4 local_ca4;
  undefined4 local_ca0;
  long local_c98;
  undefined8 local_c90;
  undefined8 local_c88;
  undefined8 local_c80;
  undefined4 local_c78;
  long *local_c70;
  undefined4 local_c68;
  undefined4 local_c64;
  undefined4 local_c60;
  undefined4 local_c5c;
  undefined4 local_c58;
  undefined8 local_c50;
  void *local_c48;
  int *local_c40;
  long local_c38;
  undefined4 local_c30;
  long *local_c28;
  undefined4 local_c20;
  int local_c1c;
  int local_c18;
  undefined4 local_c14;
  undefined4 local_c10;
  long local_c08;
  int local_c00;
  int local_bfc;
  int local_bf8;
  int local_bf4;
  int local_bf0;
  int local_bec;
  int local_be8;
  int local_be4;
  void *local_be0;
  int *local_bd8;
  ulong local_bd0;
  undefined4 local_bc8;
  long *local_bc0;
  int local_bb8;
  int local_bb4;
  int local_bb0;
  undefined4 local_bac;
  undefined4 local_ba8;
  ulong local_ba0;
  int local_b98;
  int local_b94;
  void *local_b90;
  int *local_b88;
  ulong local_b80;
  undefined4 local_b78;
  long *local_b70;
  int local_b68;
  int local_b64;
  int local_b60;
  undefined4 local_b5c;
  undefined4 local_b58;
  long local_b50;
  undefined8 local_b48;
  undefined8 local_b40;
  undefined8 local_b38;
  undefined4 local_b30;
  long *local_b28;
  undefined4 local_b20;
  undefined4 local_b1c;
  undefined4 local_b18;
  undefined4 local_b14;
  undefined4 local_b10;
  undefined8 local_b08;
  void *local_b00;
  int *local_af8;
  long local_af0;
  undefined4 local_ae8;
  long *local_ae0;
  undefined4 local_ad8;
  int local_ad4;
  int local_ad0;
  undefined4 local_acc;
  undefined4 local_ac8;
  long local_ac0;
  void *local_ab8;
  int *local_ab0;
  ulong local_aa8;
  undefined4 local_aa0;
  long *local_a98;
  int local_a90;
  int local_a8c;
  int local_a88;
  undefined4 local_a84;
  undefined4 local_a80;
  ulong local_a78;
  int local_a6c;
  int local_a68;
  int local_a64;
  int local_a60;
  int local_a5c;
  int local_a58;
  int local_a54;
  int local_a50;
  int local_a4c;
  void *local_a48;
  int *local_a40;
  ulong local_a38;
  undefined4 local_a30;
  long *local_a28;
  int local_a20;
  int local_a1c;
  int local_a18;
  undefined4 local_a14;
  undefined4 local_a10;
  long local_a08;
  undefined8 local_a00;
  undefined8 local_9f8;
  undefined8 local_9f0;
  undefined4 local_9e8;
  long *local_9e0;
  undefined4 local_9d8;
  undefined4 local_9d4;
  undefined4 local_9d0;
  undefined4 local_9cc;
  undefined4 local_9c8;
  undefined8 local_9c0;
  void *local_9b8;
  int *local_9b0;
  long local_9a8;
  undefined4 local_9a0;
  long *local_998;
  undefined4 local_990;
  int local_98c;
  int local_988;
  undefined4 local_984;
  undefined4 local_980;
  long local_978;
  int local_970;
  int local_96c;
  int local_968;
  int local_964;
  int local_960;
  int local_95c;
  int local_958;
  int local_954;
  int local_950;
  void *local_940;
  int *local_938;
  undefined8 local_930;
  undefined4 local_928;
  long *local_920;
  undefined4 local_918;
  undefined4 local_914;
  undefined4 local_910;
  undefined4 local_90c;
  undefined4 local_908;
  undefined8 local_900;
  int local_8f4;
  void *local_8f0;
  int *local_8e8;
  long local_8e0;
  undefined4 local_8d8;
  long *local_8d0;
  undefined4 local_8c8;
  int local_8c4;
  int local_8c0;
  undefined4 local_8bc;
  undefined4 local_8b8;
  long local_8b0;
  int local_8a4;
  int local_8a0;
  int local_89c;
  int local_898;
  int local_894;
  int local_890 [3];
  int local_884;
  int local_880;
  int local_87c;
  int local_878;
  int local_874;
  int local_870;
  int local_86c;
  long local_868;
  int local_85c;
  long *local_850;
  undefined8 *local_838;
  void **local_828;
  void **local_818;
  undefined8 *local_808;
  void **local_7f8;
  void **local_7e8;
  void **local_7d8;
  undefined8 *local_7c8;
  undefined8 *local_7b8;
  void **local_7a8;
  void **local_798;
  void **local_788;
  void **local_778;
  void **local_768;
  int local_748;
  undefined4 local_744;
  void **local_740;
  int local_728;
  undefined4 local_724;
  void **local_720;
  int local_708;
  undefined4 local_704;
  void **local_700;
  int local_6e8;
  undefined4 local_6e4;
  void **local_6e0;
  int local_6c8;
  undefined4 local_6c4;
  void **local_6c0;
  undefined8 *local_6a0;
  undefined8 *local_680;
  int local_668;
  undefined4 local_664;
  void **local_660;
  int local_648;
  undefined4 local_644;
  void **local_640;
  int local_628;
  undefined4 local_624;
  void **local_620;
  undefined8 *local_600;
  int local_5e8;
  undefined4 local_5e4;
  void **local_5e0;
  int local_5c8;
  undefined4 local_5c4;
  void **local_5c0;
  undefined8 *local_5a0;
  undefined1 local_595;
  int local_594;
  void **local_590;
  undefined8 *local_588;
  undefined1 local_565;
  int local_564;
  void **local_560;
  void **local_558;
  undefined1 local_535;
  int local_534;
  void **local_530;
  undefined8 *local_528;
  undefined1 local_505;
  int local_504;
  void **local_500;
  void **local_4f8;
  undefined1 local_4d5;
  int local_4d4;
  void **local_4d0;
  undefined8 *local_4c8;
  undefined1 local_4a5;
  int local_4a4;
  undefined8 *local_498;
  void *local_438;
  void *local_428;
  void *local_408;
  void *local_3f8;
  void *local_3e8;
  void *local_3b8;
  void *local_3a8;
  void *local_398;
  void *local_388;
  void *local_378;
  undefined8 local_368;
  undefined8 local_360;
  int local_354;
  undefined4 local_350;
  int local_34c;
  void **local_348;
  undefined8 local_340;
  undefined8 local_338;
  int local_32c;
  undefined4 local_328;
  int local_324;
  void **local_320;
  int local_314;
  undefined8 *local_310;
  void **local_308;
  int local_2fc;
  undefined8 *local_2f8;
  void **local_2f0;
  int local_2e4;
  undefined8 *local_2e0;
  void **local_2d8;
  long *local_2d0;
  undefined4 local_2c4;
  long local_2c0;
  void *local_2b8;
  int local_2b0;
  int local_2ac;
  void **local_2a8;
  long *local_2a0;
  undefined4 local_294;
  long local_290;
  void *local_288;
  int local_280;
  int local_27c;
  void **local_278;
  long *local_270;
  undefined4 local_264;
  long local_260;
  void *local_258;
  int local_250;
  int local_24c;
  void **local_248;
  long *local_240;
  undefined4 local_234;
  long local_230;
  long local_228;
  undefined4 local_21c;
  int local_218;
  int local_214;
  undefined8 *local_210;
  long *local_208;
  undefined4 local_1fc;
  long local_1f8;
  void *local_1f0;
  undefined4 local_1e4;
  int local_1e0;
  int local_1dc;
  undefined8 *local_1d8;
  long *local_1d0;
  undefined4 local_1c4;
  ulong local_1c0;
  void *local_1b8;
  undefined4 local_1ac;
  int local_1a8;
  int local_1a4;
  void **local_1a0;
  long *local_198;
  undefined4 local_18c;
  long local_188;
  void *local_180;
  undefined4 local_174;
  int local_170;
  int local_16c;
  undefined8 *local_168;
  long *local_160;
  undefined4 local_154;
  ulong local_150;
  void *local_148;
  undefined4 local_13c;
  int local_138;
  int local_134;
  void **local_130;
  long *local_128;
  undefined4 local_11c;
  long local_118;
  void *local_110;
  undefined4 local_104;
  int local_100;
  int local_fc;
  undefined8 *local_f8;
  undefined4 local_ec;
  long local_e8;
  undefined4 local_dc;
  long local_d8;
  undefined4 local_cc;
  long local_c8;
  undefined4 local_bc;
  long local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined8 local_90;
  undefined8 local_88;
  int local_80;
  int local_7c;
  undefined4 local_78;
  int local_74;
  void **local_70;
  undefined8 local_68;
  undefined8 local_60;
  int local_54;
  void **local_50;
  int local_44;
  undefined8 *local_40;
  undefined8 in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  Mat *in_stack_ffffffffffffffe0;
  
  local_86c = *(int *)(in_RSI + 0x2c);
  local_870 = *(int *)(in_RSI + 0x30);
  local_874 = (local_86c + 1) / 2;
  local_878 = (local_870 + 1) / 2;
  local_884 = local_874 * local_878;
  local_880 = *(int *)(in_RSI + 0x38) * *(int *)(in_RSI + 0x18);
  local_890[2] = *(int *)(in_RDI + 0x38) * *(int *)(in_RDI + 0x18);
  local_890[1] = 0x10;
  local_87c = local_884;
  local_868 = in_R9;
  local_85c = in_R8D;
  local_850 = in_RDX;
  get_optimal_tile_mnk
            ((int)((ulong)in_stack_fffffffffffff180 >> 0x20),(int)in_stack_fffffffffffff180,
             (int)((ulong)in_stack_fffffffffffff178 >> 0x20),in_stack_fffffffffffff170,
             in_stack_fffffffffffff168,in_stack_fffffffffffff160,(int)in_stack_fffffffffffff190);
  local_89c = (local_880 + local_890[0] + -1) / local_890[0];
  local_8a0 = (local_884 + local_894 + -1) / local_894;
  local_8a4 = (local_890[2] + local_898 + -1) / local_898;
  local_74 = local_898 * local_894;
  local_7c = (local_890[2] + local_898 + -1) / local_898;
  local_80 = (local_884 + local_894 + -1) / local_894;
  local_90 = *(undefined8 *)(local_868 + 0x10);
  local_70 = &local_8f0;
  local_78 = 0x10;
  local_88 = 4;
  local_8f0 = (void *)0x0;
  local_8e8 = (int *)0x0;
  local_8e0 = 0;
  local_8d8 = 0;
  local_8d0 = (long *)0x0;
  local_8c8 = 0;
  local_8c4 = 0;
  local_8c0 = 0;
  local_8bc = 0;
  local_8b8 = 0;
  local_8b0 = 0;
  Mat::create(in_stack_fffffffffffff130,(int)(in_stack_fffffffffffff128 >> 0x20),
              (int)in_stack_fffffffffffff128,in_stack_fffffffffffff124,in_stack_fffffffffffff120,
              CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118),
              in_stack_fffffffffffff190);
  local_8f4 = local_8a0 * local_8a4;
  if ((local_85c < 2) || (local_85c <= local_8f4)) {
    local_34c = local_894 * local_898 * 0x10;
    local_368 = *(undefined8 *)(local_868 + 0x10);
    local_348 = &local_a48;
    local_350 = 1;
    local_354 = local_85c;
    local_360 = 4;
    local_a48 = (void *)0x0;
    local_a40 = (int *)0x0;
    local_a38 = 0;
    local_a30 = 0;
    local_a28 = (long *)0x0;
    local_a20 = 0;
    local_a1c = 0;
    local_a18 = 0;
    local_a14 = 0;
    local_a10 = 0;
    local_a08 = 0;
    Mat::create(in_stack_fffffffffffff140,in_stack_fffffffffffff13c,in_stack_fffffffffffff138,
                (int)((ulong)in_stack_fffffffffffff130 >> 0x20),in_stack_fffffffffffff128,
                (Allocator *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
    for (local_a4c = 0; _c = (int)((ulong)in_stack_fffffffffffff130 >> 0x20), local_a4c < local_8f4;
        local_a4c = local_a4c + 1) {
      local_a50 = local_a4c / local_8a4;
      local_a54 = local_a4c % local_8a4;
      local_a58 = local_a50 * local_894;
      local_a5c = local_a54 * local_898;
      local_a64 = local_884 - local_a58;
      piVar1 = std::min<int>(&local_a64,&local_894);
      local_a60 = *piVar1;
      local_a6c = local_890[2] - local_a5c;
      piVar1 = std::min<int>(&local_a6c,&local_898);
      local_a68 = *piVar1;
      local_504 = get_omp_thread_num();
      local_4f8 = &local_ab8;
      local_500 = &local_a48;
      local_1b8 = (void *)((long)local_a48 + local_a08 * local_504 * local_a38);
      local_1a0 = &local_ab8;
      local_ab0 = (int *)0x0;
      local_aa8 = local_a38;
      local_aa0 = local_a30;
      local_a98 = local_a28;
      local_a8c = local_a1c;
      local_a88 = local_a18;
      local_a84 = 1;
      local_a80 = local_a14;
      local_b8 = (long)local_a1c * (long)local_a18 * local_a38;
      local_a78 = (local_b8 + 0xfU & 0xfffffffffffffff0) / local_a38;
      local_a90 = local_a20 + -1;
      if (local_a20 == 4) {
        local_a78 = (long)local_a1c * (long)local_a18;
      }
      local_bc = 0x10;
      local_1a4 = local_a1c;
      local_1a8 = local_a18;
      local_1ac = local_a14;
      local_1c0 = local_a38;
      local_1c4 = local_a30;
      local_1d0 = local_a28;
      local_505 = 1;
      local_ab8 = local_1b8;
      conv3x3s1_winograd23_transform_input_tile
                (in_stack_00000988,in_stack_00000980,in_stack_0000097c,in_stack_00000978,m_5._4_4_,
                 (int)m_5,in_stack_fffffffffffff110);
      local_534 = local_a58 / local_894;
      local_528 = &local_b48;
      local_530 = &local_8f0;
      local_180 = (void *)((long)local_8f0 + local_8b0 * local_534 * local_8e0);
      local_168 = &local_b48;
      local_c8 = (long)local_8c4 * (long)local_8c0 * local_8e0;
      local_2fc = local_a5c / local_898;
      local_2f0 = &local_b00;
      local_2f8 = &local_b48;
      local_288 = (void *)((long)local_180 +
                          (long)local_8c4 * (long)local_8c0 * (long)local_2fc * local_8e0);
      local_278 = &local_b00;
      local_ac0 = (long)local_8c4 * (long)local_8c0;
      local_808 = &local_b48;
      local_ac8 = 1;
      local_acc = 1;
      local_ad0 = local_8c0;
      local_ad4 = local_8c4;
      local_ad8 = 2;
      local_ae0 = local_8d0;
      local_ae8 = local_8d8;
      local_af0 = local_8e0;
      local_af8 = (int *)0x0;
      local_b28 = local_8d0;
      local_cc = 0x10;
      local_16c = local_8c4;
      local_170 = local_8c0;
      local_174 = local_8bc;
      local_188 = local_8e0;
      local_18c = local_8d8;
      local_198 = local_8d0;
      local_27c = local_8c4;
      local_280 = local_8c0;
      local_290 = local_8e0;
      local_294 = local_8d8;
      local_2a0 = local_8d0;
      local_535 = 1;
      local_b48 = 0;
      local_b38 = 0;
      local_b30 = 0;
      local_b20 = 0;
      local_b1c = 0;
      local_b18 = 0;
      local_b14 = 0;
      local_b10 = 0;
      local_b08 = 0;
      local_b40 = 0;
      local_600 = local_808;
      local_b00 = local_288;
      transpose_pack_B_tile
                (in_stack_ffffffffffffffe0,
                 (Mat *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),(int)in_stack_ffffffffffffffd0,
                 (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(int)in_stack_ffffffffffffffc8);
      local_7f8 = &local_b00;
      local_620 = local_7f8;
      if (local_af8 != (int *)0x0) {
        local_624 = 0xffffffff;
        LOCK();
        local_628 = *local_af8;
        *local_af8 = *local_af8 + -1;
        UNLOCK();
        if (local_628 == 1) {
          if (local_ae0 == (long *)0x0) {
            local_408 = local_b00;
            if (local_b00 != (void *)0x0) {
              free(local_b00);
            }
          }
          else {
            (**(code **)(*local_ae0 + 0x18))(local_ae0,local_b00);
          }
        }
      }
      local_b00 = (void *)0x0;
      local_af0 = 0;
      local_ae8 = 0;
      local_ad8 = 0;
      local_ad4 = 0;
      local_ad0 = 0;
      local_acc = 0;
      local_ac8 = 0;
      local_ac0 = 0;
      local_af8 = (int *)0x0;
      local_7e8 = &local_ab8;
      local_640 = local_7e8;
      if (local_ab0 != (int *)0x0) {
        local_644 = 0xffffffff;
        LOCK();
        local_648 = *local_ab0;
        *local_ab0 = *local_ab0 + -1;
        UNLOCK();
        if (local_648 == 1) {
          if (local_a98 == (long *)0x0) {
            local_3f8 = local_ab8;
            if (local_ab8 != (void *)0x0) {
              free(local_ab8);
            }
          }
          else {
            (**(code **)(*local_a98 + 0x18))(local_a98,local_ab8);
          }
        }
      }
      local_ab8 = (void *)0x0;
      local_aa8 = 0;
      local_aa0 = 0;
      local_a90 = 0;
      local_a8c = 0;
      local_a88 = 0;
      local_a84 = 0;
      local_a80 = 0;
      local_a78 = 0;
      local_ab0 = (int *)0x0;
    }
    local_7d8 = &local_a48;
    local_660 = local_7d8;
    if (local_a40 != (int *)0x0) {
      local_664 = 0xffffffff;
      LOCK();
      local_668 = *local_a40;
      *local_a40 = *local_a40 + -1;
      UNLOCK();
      if (local_668 == 1) {
        if (local_a28 == (long *)0x0) {
          local_3e8 = local_a48;
          if (local_a48 != (void *)0x0) {
            free(local_a48);
          }
        }
        else {
          (**(code **)(*local_a28 + 0x18))(local_a28,local_a48);
        }
      }
    }
    local_a48 = (void *)0x0;
    local_a38 = 0;
    local_a30 = 0;
    local_a20 = 0;
    local_a1c = 0;
    local_a18 = 0;
    local_a14 = 0;
    local_a10 = 0;
    local_a08 = 0;
    local_a40 = (int *)0x0;
  }
  else {
    local_54 = local_894 * local_898 * 0x10;
    local_68 = *(undefined8 *)(local_868 + 0x10);
    local_50 = &local_940;
    local_60 = 4;
    local_940 = (void *)0x0;
    local_938 = (int *)0x0;
    local_930 = 0;
    local_928 = 0;
    local_920 = (long *)0x0;
    local_918 = 0;
    local_914 = 0;
    local_910 = 0;
    local_90c = 0;
    local_908 = 0;
    local_900 = 0;
    Mat::create(in_stack_fffffffffffff130,(int)(in_stack_fffffffffffff128 >> 0x20),
                CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120),
                (Allocator *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    for (local_950 = 0; _c = (int)((ulong)in_stack_fffffffffffff130 >> 0x20), local_950 < local_8f4;
        local_950 = local_950 + 1) {
      local_954 = local_950 / local_8a4;
      local_958 = local_950 % local_8a4;
      local_95c = local_954 * local_894;
      local_960 = local_958 * local_898;
      local_968 = local_884 - local_95c;
      piVar1 = std::min<int>(&local_968,&local_894);
      local_964 = *piVar1;
      local_970 = local_890[2] - local_960;
      piVar1 = std::min<int>(&local_970,&local_898);
      local_96c = *piVar1;
      conv3x3s1_winograd23_transform_input_tile
                (in_stack_00000988,in_stack_00000980,in_stack_0000097c,in_stack_00000978,m_5._4_4_,
                 (int)m_5,in_stack_fffffffffffff110);
      local_4d4 = local_95c / local_894;
      local_4c8 = &local_a00;
      local_4d0 = &local_8f0;
      local_1f0 = (void *)((long)local_8f0 + local_8b0 * local_4d4 * local_8e0);
      local_1d8 = &local_a00;
      local_a8 = (long)local_8c4 * (long)local_8c0 * local_8e0;
      local_2e4 = local_960 / local_898;
      local_2d8 = &local_9b8;
      local_2e0 = &local_a00;
      local_2b8 = (void *)((long)local_1f0 +
                          (long)local_8c4 * (long)local_8c0 * (long)local_2e4 * local_8e0);
      local_2a8 = &local_9b8;
      local_978 = (long)local_8c4 * (long)local_8c0;
      local_838 = &local_a00;
      local_980 = 1;
      local_984 = 1;
      local_988 = local_8c0;
      local_98c = local_8c4;
      local_990 = 2;
      local_998 = local_8d0;
      local_9a0 = local_8d8;
      local_9a8 = local_8e0;
      local_9b0 = (int *)0x0;
      local_9e0 = local_8d0;
      local_ac = 0x10;
      local_1dc = local_8c4;
      local_1e0 = local_8c0;
      local_1e4 = local_8bc;
      local_1f8 = local_8e0;
      local_1fc = local_8d8;
      local_208 = local_8d0;
      local_2ac = local_8c4;
      local_2b0 = local_8c0;
      local_2c0 = local_8e0;
      local_2c4 = local_8d8;
      local_2d0 = local_8d0;
      local_4d5 = 1;
      local_a00 = 0;
      local_9f0 = 0;
      local_9e8 = 0;
      local_9d8 = 0;
      local_9d4 = 0;
      local_9d0 = 0;
      local_9cc = 0;
      local_9c8 = 0;
      local_9c0 = 0;
      local_9f8 = 0;
      local_5a0 = local_838;
      local_9b8 = local_2b8;
      transpose_pack_B_tile
                (in_stack_ffffffffffffffe0,
                 (Mat *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),(int)in_stack_ffffffffffffffd0,
                 (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(int)in_stack_ffffffffffffffc8);
      local_828 = &local_9b8;
      local_5c0 = local_828;
      if (local_9b0 != (int *)0x0) {
        local_5c4 = 0xffffffff;
        LOCK();
        local_5c8 = *local_9b0;
        *local_9b0 = *local_9b0 + -1;
        UNLOCK();
        if (local_5c8 == 1) {
          if (local_998 == (long *)0x0) {
            local_438 = local_9b8;
            if (local_9b8 != (void *)0x0) {
              free(local_9b8);
            }
          }
          else {
            (**(code **)(*local_998 + 0x18))(local_998,local_9b8);
          }
        }
      }
      local_9b8 = (void *)0x0;
      local_9a8 = 0;
      local_9a0 = 0;
      local_990 = 0;
      local_98c = 0;
      local_988 = 0;
      local_984 = 0;
      local_980 = 0;
      local_978 = 0;
      local_9b0 = (int *)0x0;
    }
    local_818 = &local_940;
    local_5e0 = local_818;
    if (local_938 != (int *)0x0) {
      local_5e4 = 0xffffffff;
      LOCK();
      local_5e8 = *local_938;
      *local_938 = *local_938 + -1;
      UNLOCK();
      if (local_5e8 == 1) {
        if (local_920 == (long *)0x0) {
          local_428 = local_940;
          if (local_940 != (void *)0x0) {
            free(local_940);
          }
        }
        else {
          (**(code **)(*local_920 + 0x18))(local_920,local_940);
        }
      }
    }
    local_940 = (void *)0x0;
    local_930 = 0;
    local_928 = 0;
    local_918 = 0;
    local_914 = 0;
    local_910 = 0;
    local_90c = 0;
    local_908 = 0;
    local_900 = 0;
    local_938 = (int *)0x0;
  }
  local_324 = local_894 * local_890[0] * 0x10;
  local_340 = *(undefined8 *)(local_868 + 0x10);
  local_320 = &local_b90;
  local_328 = 1;
  local_32c = local_85c;
  local_338 = 4;
  local_b90 = (void *)0x0;
  local_b88 = (int *)0x0;
  local_b80 = 0;
  local_b78 = 0;
  local_b70 = (long *)0x0;
  local_b68 = 0;
  local_b64 = 0;
  local_b60 = 0;
  local_b5c = 0;
  local_b58 = 0;
  local_b50 = 0;
  Mat::create(in_stack_fffffffffffff140,in_stack_fffffffffffff13c,in_stack_fffffffffffff138,_c,
              in_stack_fffffffffffff128,
              (Allocator *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  for (local_b94 = 0; local_b94 < local_89c; local_b94 = local_b94 + 1) {
    local_b98 = local_b94 * local_890[0];
    local_564 = get_omp_thread_num();
    local_558 = &local_be0;
    local_560 = &local_b90;
    local_148 = (void *)((long)local_b90 + local_b50 * local_564 * local_b80);
    local_130 = &local_be0;
    local_bd8 = (int *)0x0;
    local_bd0 = local_b80;
    local_bc8 = local_b78;
    local_bc0 = local_b70;
    local_bb4 = local_b64;
    local_bb0 = local_b60;
    local_bac = 1;
    local_ba8 = local_b5c;
    local_d8 = (long)local_b64 * (long)local_b60 * local_b80;
    local_ba0 = (local_d8 + 0xfU & 0xfffffffffffffff0) / local_b80;
    local_bb8 = local_b68 + -1;
    if (local_b68 == 4) {
      local_ba0 = (long)local_b64 * (long)local_b60;
    }
    local_dc = 0x10;
    local_134 = local_b64;
    local_138 = local_b60;
    local_13c = local_b5c;
    local_150 = local_b80;
    local_154 = local_b78;
    local_160 = local_b70;
    local_565 = 1;
    local_be8 = local_880 - local_b98;
    local_be0 = local_148;
    piVar1 = std::min<int>(&local_be8,local_890);
    local_be4 = *piVar1;
    for (local_bec = 0; local_bec < local_884; local_bec = local_894 + local_bec) {
      local_bf4 = local_884 - local_bec;
      piVar1 = std::min<int>(&local_bf4,&local_894);
      local_bf0 = *piVar1;
      for (local_bf8 = 0; local_bf8 < local_890[2]; local_bf8 = local_898 + local_bf8) {
        local_c00 = local_890[2] - local_bf8;
        piVar1 = std::min<int>(&local_c00,&local_898);
        in_stack_fffffffffffff110 = *piVar1;
        local_4a4 = local_b98 / local_890[0];
        local_498 = &local_c90;
        local_214 = *(int *)((long)local_850 + 0x2c);
        local_218 = (int)local_850[6];
        local_21c = *(undefined4 *)((long)local_850 + 0x34);
        local_228 = *local_850 + local_850[8] * (long)local_4a4 * local_850[2];
        local_230 = local_850[2];
        local_234 = (undefined4)local_850[3];
        local_240 = (long *)local_850[4];
        local_210 = &local_c90;
        local_98 = (long)local_214 * (long)local_218 * local_230;
        local_44 = local_bf8 / local_898;
        local_40 = &local_c90;
        local_c48 = (void *)(local_228 +
                            (long)local_214 * (long)local_218 * (long)local_44 * local_230);
        local_c08 = (long)local_214 * (long)local_218;
        local_7c8 = &local_c90;
        local_594 = local_bec / local_894;
        local_588 = &local_d20;
        local_590 = &local_8f0;
        local_110 = (void *)((long)local_8f0 + local_8b0 * local_594 * local_8e0);
        local_f8 = &local_d20;
        local_e8 = (long)local_8c4 * (long)local_8c0 * local_8e0;
        local_314 = local_bf8 / local_898;
        local_308 = &local_cd8;
        local_310 = &local_d20;
        local_258 = (void *)((long)local_110 +
                            (long)local_8c4 * (long)local_8c0 * (long)local_314 * local_8e0);
        local_248 = &local_cd8;
        local_c98 = (long)local_8c4 * (long)local_8c0;
        local_7b8 = &local_d20;
        local_c10 = 1;
        local_c14 = 1;
        local_c20 = 2;
        local_c40 = (int *)0x0;
        local_c58 = 0;
        local_c5c = 0;
        local_c60 = 0;
        local_c64 = 0;
        local_c78 = 0;
        local_c80 = 0;
        local_c88 = 0;
        local_c90 = 0;
        local_ca0 = 1;
        local_ca4 = 1;
        local_ca8 = local_8c0;
        local_cac = local_8c4;
        local_cb0 = 2;
        local_cb8 = local_8d0;
        local_cc0 = local_8d8;
        local_cc8 = local_8e0;
        local_cd0 = (int *)0x0;
        local_d00 = local_8d0;
        local_9c = 0x10;
        local_ec = 0x10;
        local_fc = local_8c4;
        local_100 = local_8c0;
        local_104 = local_8bc;
        local_118 = local_8e0;
        local_11c = local_8d8;
        local_128 = local_8d0;
        local_24c = local_8c4;
        local_250 = local_8c0;
        local_260 = local_8e0;
        local_264 = local_8d8;
        local_270 = local_8d0;
        local_4a5 = 1;
        local_595 = 1;
        local_c50 = 0;
        local_c68 = 0;
        local_d20 = 0;
        local_d10 = 0;
        local_d08 = 0;
        local_cf8 = 0;
        local_cf4 = 0;
        local_cf0 = 0;
        local_cec = 0;
        local_ce8 = 0;
        local_ce0 = 0;
        local_d18 = 0;
        local_bfc = in_stack_fffffffffffff110;
        local_6a0 = local_7b8;
        local_680 = local_7c8;
        local_cd8 = local_258;
        local_c70 = local_240;
        local_c38 = local_230;
        local_c30 = local_234;
        local_c28 = local_240;
        local_c1c = local_214;
        local_c18 = local_218;
        gemm_transB_packed_tile
                  (in_stack_00000ff8,in_stack_00000ff0,in_stack_00000fe8,in_stack_00000fe4,
                   in_stack_00000fe0,in_stack_00000fdc,in_stack_fffffffffffff110,
                   in_stack_fffffffffffff118);
        ppvVar2 = &local_cd8;
        local_7a8 = ppvVar2;
        local_6c0 = ppvVar2;
        if (local_cd0 != (int *)0x0) {
          local_6c4 = 0xffffffff;
          LOCK();
          local_6c8 = *local_cd0;
          *local_cd0 = *local_cd0 + -1;
          UNLOCK();
          if (local_6c8 == 1) {
            if (local_cb8 == (long *)0x0) {
              local_3b8 = local_cd8;
              if (local_cd8 != (void *)0x0) {
                free(local_cd8);
              }
            }
            else {
              (**(code **)(*local_cb8 + 0x18))(local_cb8,local_cd8);
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        ppvVar2[2] = (void *)0x0;
        *(undefined4 *)(ppvVar2 + 3) = 0;
        *(undefined4 *)(ppvVar2 + 5) = 0;
        *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
        *(undefined4 *)(ppvVar2 + 6) = 0;
        *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
        *(undefined4 *)(ppvVar2 + 7) = 0;
        ppvVar2[8] = (void *)0x0;
        ppvVar2[1] = (void *)0x0;
        local_798 = &local_c48;
        local_6e0 = local_798;
        if (local_c40 != (int *)0x0) {
          local_6e4 = 0xffffffff;
          LOCK();
          local_6e8 = *local_c40;
          *local_c40 = *local_c40 + -1;
          UNLOCK();
          if (local_6e8 == 1) {
            if (local_c28 == (long *)0x0) {
              local_3a8 = local_c48;
              if (local_c48 != (void *)0x0) {
                free(local_c48);
              }
            }
            else {
              (**(code **)(*local_c28 + 0x18))(local_c28,local_c48);
            }
          }
        }
        local_c48 = (void *)0x0;
        local_c38 = 0;
        local_c30 = 0;
        local_c20 = 0;
        local_c1c = 0;
        local_c18 = 0;
        local_c14 = 0;
        local_c10 = 0;
        local_c08 = 0;
        local_c40 = (int *)0x0;
      }
      conv3x3s1_winograd23_transform_output_tile
                (in_stack_000001c0,in_stack_000001b8,in_stack_000001b0,in_stack_000001ac,
                 in_stack_000001a8,in_stack_000001a4,in_stack_fffffffffffff110);
    }
    ppvVar2 = &local_be0;
    local_788 = ppvVar2;
    local_700 = ppvVar2;
    if (local_bd8 != (int *)0x0) {
      local_704 = 0xffffffff;
      LOCK();
      local_708 = *local_bd8;
      *local_bd8 = *local_bd8 + -1;
      UNLOCK();
      if (local_708 == 1) {
        if (local_bc0 == (long *)0x0) {
          local_398 = local_be0;
          if (local_be0 != (void *)0x0) {
            free(local_be0);
          }
        }
        else {
          (**(code **)(*local_bc0 + 0x18))(local_bc0,local_be0);
        }
      }
    }
    *ppvVar2 = (void *)0x0;
    ppvVar2[2] = (void *)0x0;
    *(undefined4 *)(ppvVar2 + 3) = 0;
    *(undefined4 *)(ppvVar2 + 5) = 0;
    *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
    *(undefined4 *)(ppvVar2 + 6) = 0;
    *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
    *(undefined4 *)(ppvVar2 + 7) = 0;
    ppvVar2[8] = (void *)0x0;
    ppvVar2[1] = (void *)0x0;
  }
  ppvVar2 = &local_b90;
  local_778 = ppvVar2;
  local_720 = ppvVar2;
  if (local_b88 != (int *)0x0) {
    local_724 = 0xffffffff;
    LOCK();
    local_728 = *local_b88;
    *local_b88 = *local_b88 + -1;
    UNLOCK();
    if (local_728 == 1) {
      if (local_b70 == (long *)0x0) {
        local_388 = local_b90;
        if (local_b90 != (void *)0x0) {
          free(local_b90);
        }
      }
      else {
        (**(code **)(*local_b70 + 0x18))(local_b70,local_b90);
      }
    }
  }
  *ppvVar2 = (void *)0x0;
  ppvVar2[2] = (void *)0x0;
  *(undefined4 *)(ppvVar2 + 3) = 0;
  *(undefined4 *)(ppvVar2 + 5) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
  *(undefined4 *)(ppvVar2 + 6) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
  *(undefined4 *)(ppvVar2 + 7) = 0;
  ppvVar2[8] = (void *)0x0;
  ppvVar2[1] = (void *)0x0;
  ppvVar2 = &local_8f0;
  if (local_8e8 != (int *)0x0) {
    local_744 = 0xffffffff;
    LOCK();
    local_748 = *local_8e8;
    *local_8e8 = *local_8e8 + -1;
    UNLOCK();
    if (local_748 == 1) {
      local_768 = ppvVar2;
      local_740 = ppvVar2;
      if (local_8d0 == (long *)0x0) {
        local_378 = local_8f0;
        if (local_8f0 != (void *)0x0) {
          free(local_8f0);
        }
      }
      else {
        (**(code **)(*local_8d0 + 0x18))(local_8d0,local_8f0);
      }
    }
  }
  *ppvVar2 = (void *)0x0;
  ppvVar2[2] = (void *)0x0;
  *(undefined4 *)(ppvVar2 + 3) = 0;
  *(undefined4 *)(ppvVar2 + 5) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
  *(undefined4 *)(ppvVar2 + 6) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
  *(undefined4 *)(ppvVar2 + 7) = 0;
  ppvVar2[8] = (void *)0x0;
  ppvVar2[1] = (void *)0x0;
  return;
}

Assistant:

static void conv3x3s1_winograd23(const Mat& bottom_blob, Mat& top_blob, const Mat& AT, const Mat& bias, int nT, const Option& opt)
{
    int outw = top_blob.w;
    int outh = top_blob.h;

    // pad to 2n+2, winograd F(2,3)
    int w_tiles = (outw + 1) / 2;
    int h_tiles = (outh + 1) / 2;
    int tiles = w_tiles * h_tiles;

    const int M = top_blob.c * top_blob.elempack;
    const int N = tiles;
    const int K = bottom_blob.c * bottom_blob.elempack;
    const int B = 16;

    // NCNN_LOGE("conv3x3s1_winograd23 %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, N, K, TILE_M, TILE_N, TILE_K, nT);

    const int nn_M = (M + TILE_M - 1) / TILE_M;
    const int nn_N = (N + TILE_N - 1) / TILE_N;
    const int nn_K = (K + TILE_K - 1) / TILE_K;

    // NCNN_LOGE("TILE M/N/K = %d %d %d -> %d %d %d", M, N, K, TILE_M, TILE_N, TILE_K);

    Mat BT(TILE_K * TILE_N, B, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, opt.workspace_allocator);

    const int nn_NK = nn_N * nn_K;

    if (nT > 1 && nn_NK < nT)
    {
        Mat B_tile(TILE_N * B * TILE_K, 4u, opt.workspace_allocator);

        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            // transform input
            conv3x3s1_winograd23_transform_input_tile(bottom_blob, B_tile, j, max_jj, k, max_kk, nT);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile(B_tile, BT_tile, B, max_jj, max_kk, nT);
        }
    }
    else
    {
        Mat B_tileX(TILE_N * B * TILE_K, 1, nT, 4u, opt.workspace_allocator);

        #pragma omp parallel for num_threads(nT)
        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            Mat B_tile = B_tileX.channel(get_omp_thread_num());

            // transform input
            conv3x3s1_winograd23_transform_input_tile(bottom_blob, B_tile, j, max_jj, k, max_kk, 1);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile(B_tile, BT_tile, B, max_jj, max_kk, 1);
        }
    }

    Mat top_tileX(TILE_N * B * TILE_M, 1, nT, 4u, opt.workspace_allocator);

    #pragma omp parallel for num_threads(nT)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat top_tile = top_tileX.channel(get_omp_thread_num());

        const int max_ii = std::min((M - i), TILE_M);

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                const Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

                const Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

                gemm_transB_packed_tile(AT_tile, BT_tile, top_tile, B, max_ii, max_jj, k, max_kk);
            }

            // transform output
            conv3x3s1_winograd23_transform_output_tile(top_tile, top_blob, bias, i, max_ii, j, max_jj);
        }
    }
}